

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_main.cpp
# Opt level: O3

void ParseCVarInfo(void)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  FBaseCVar *pFVar4;
  uint flags;
  UCVarValue val;
  char *pcVar5;
  ECVarType var_type;
  FString cvarname;
  int lastlump;
  FScanner sc;
  FString local_148;
  int local_13c;
  char *local_138;
  FScanner local_130;
  
  local_13c = 0;
  iVar3 = FWadCollection::FindLump(&Wads,"CVARINFO",&local_13c,false);
  if (iVar3 != -1) {
    local_138 = FString::NullString.Nothing;
    bVar2 = false;
    do {
      FScanner::FScanner(&local_130,iVar3);
      FScanner::SetCMode(&local_130,true);
      while (bVar1 = FScanner::GetToken(&local_130), bVar1) {
        local_148.Chars = local_138;
        FString::NullString.RefCount = FString::NullString.RefCount + 1;
        flags = 0x2001;
        while (pcVar5 = local_130.String, local_130.TokenType == 0x101) {
          iVar3 = strcasecmp(local_130.String,"server");
          if (iVar3 == 0) {
            flags = flags | 4;
          }
          else {
            iVar3 = strcasecmp(pcVar5,"user");
            if (iVar3 == 0) {
              flags = flags | 2;
            }
            else {
              iVar3 = strcasecmp(pcVar5,"noarchive");
              if (iVar3 == 0) {
                flags = flags & 0xfffffffe;
              }
              else {
                FScanner::ScriptError(&local_130,"Unknown cvar attribute \'%s\'",pcVar5);
              }
            }
          }
          FScanner::MustGetAnyToken(&local_130);
        }
        if (((flags & 6) == 6) || ((flags & 6) == 0)) {
          FScanner::ScriptError(&local_130,"One of \'server\' or \'user\' must be specified");
        }
        if (local_130.TokenType < 0x13a) {
          var_type = CVAR_Bool;
          if (local_130.TokenType != 0x132) {
            if (local_130.TokenType == 0x133) {
              var_type = CVAR_Float;
            }
            else {
LAB_004b9fb6:
              var_type = CVAR_Dummy;
              FScanner::ScriptError(&local_130,"Bad cvar type \'%s\'",local_130.String);
            }
          }
        }
        else if (local_130.TokenType == 0x147) {
          var_type = CVAR_Color;
        }
        else if (local_130.TokenType == 0x144) {
          var_type = CVAR_String;
        }
        else {
          if (local_130.TokenType != 0x13a) goto LAB_004b9fb6;
          var_type = CVAR_Int;
        }
        FScanner::MustGetToken(&local_130,0x101);
        pFVar4 = FindCVar(local_130.String,(FBaseCVar **)0x0);
        if (pFVar4 != (FBaseCVar *)0x0) {
          FScanner::ScriptError(&local_130,"cvar \'%s\' already exists",local_130.String);
        }
        FString::operator=(&local_148,local_130.String);
        bVar2 = FScanner::CheckToken(&local_130,0x3d);
        if (bVar2) {
          if (var_type == CVAR_Float) {
            FScanner::MustGetFloat(&local_130);
            pcVar5 = local_130.String;
          }
          else if (var_type == CVAR_Int) {
            FScanner::MustGetNumber(&local_130);
            pcVar5 = local_130.String;
          }
          else if (var_type == CVAR_Bool) {
            bVar2 = FScanner::CheckToken(&local_130,0x14b);
            pcVar5 = local_130.String;
            if ((!bVar2) &&
               (bVar2 = FScanner::CheckToken(&local_130,0x14c), pcVar5 = local_130.String, !bVar2))
            {
              FScanner::ScriptError(&local_130,"Expected true or false");
              pcVar5 = local_130.String;
            }
          }
          else {
            FScanner::MustGetString(&local_130);
            pcVar5 = local_130.String;
          }
        }
        else {
          pcVar5 = (char *)0x0;
        }
        pFVar4 = C_CreateCVar(local_148.Chars,var_type,flags);
        if (pcVar5 != (char *)0x0) {
          (*pFVar4->_vptr_FBaseCVar[8])(pFVar4,pcVar5,3);
        }
        FScanner::MustGetToken(&local_130,0x3b);
        FString::~FString(&local_148);
        bVar2 = true;
      }
      FScanner::~FScanner(&local_130);
      iVar3 = FWadCollection::FindLump(&Wads,"CVARINFO",&local_13c,false);
    } while (iVar3 != -1);
    if (bVar2) {
      FGameConfigFile::DoModSetup(GameConfig,gameinfo.ConfigName.Chars);
    }
  }
  return;
}

Assistant:

void ParseCVarInfo()
{
	int lump, lastlump = 0;
	bool addedcvars = false;

	while ((lump = Wads.FindLump("CVARINFO", &lastlump)) != -1)
	{
		FScanner sc(lump);
		sc.SetCMode(true);

		while (sc.GetToken())
		{
			FString cvarname;
			char *cvardefault = NULL;
			ECVarType cvartype = CVAR_Dummy;
			int cvarflags = CVAR_MOD|CVAR_ARCHIVE;
			FBaseCVar *cvar;

			// Check for flag tokens.
			while (sc.TokenType == TK_Identifier)
			{
				if (stricmp(sc.String, "server") == 0)
				{
					cvarflags |= CVAR_SERVERINFO;
				}
				else if (stricmp(sc.String, "user") == 0)
				{
					cvarflags |= CVAR_USERINFO;
				}
				else if (stricmp(sc.String, "noarchive") == 0)
				{
					cvarflags &= ~CVAR_ARCHIVE;
				}
				else
				{
					sc.ScriptError("Unknown cvar attribute '%s'", sc.String);
				}
				sc.MustGetAnyToken();
			}
			// Do some sanity checks.
			if ((cvarflags & (CVAR_SERVERINFO|CVAR_USERINFO)) == 0 ||
				(cvarflags & (CVAR_SERVERINFO|CVAR_USERINFO)) == (CVAR_SERVERINFO|CVAR_USERINFO))
			{
				sc.ScriptError("One of 'server' or 'user' must be specified");
			}
			// The next token must be the cvar type.
			if (sc.TokenType == TK_Bool)
			{
				cvartype = CVAR_Bool;
			}
			else if (sc.TokenType == TK_Int)
			{
				cvartype = CVAR_Int;
			}
			else if (sc.TokenType == TK_Float)
			{
				cvartype = CVAR_Float;
			}
			else if (sc.TokenType == TK_Color)
			{
				cvartype = CVAR_Color;
			}
			else if (sc.TokenType == TK_String)
			{
				cvartype = CVAR_String;
			}
			else
			{
				sc.ScriptError("Bad cvar type '%s'", sc.String);
			}
			// The next token must be the cvar name.
			sc.MustGetToken(TK_Identifier);
			if (FindCVar(sc.String, NULL) != NULL)
			{
				sc.ScriptError("cvar '%s' already exists", sc.String);
			}
			cvarname = sc.String;
			// A default value is optional and signalled by a '=' token.
			if (sc.CheckToken('='))
			{
				switch (cvartype)
				{
				case CVAR_Bool:
					if (!sc.CheckToken(TK_True) && !sc.CheckToken(TK_False))
					{
						sc.ScriptError("Expected true or false");
					}
					cvardefault = sc.String;
					break;
				case CVAR_Int:
					sc.MustGetNumber();
					cvardefault = sc.String;
					break;
				case CVAR_Float:
					sc.MustGetFloat();
					cvardefault = sc.String;
					break;
				default:
					sc.MustGetString();
					cvardefault = sc.String;
					break;
				}
			}
			// Now create the cvar.
			cvar = C_CreateCVar(cvarname, cvartype, cvarflags);
			if (cvardefault != NULL)
			{
				UCVarValue val;
				val.String = cvardefault;
				cvar->SetGenericRepDefault(val, CVAR_String);
			}
			// To be like C and ACS, require a semicolon after everything.
			sc.MustGetToken(';');
			addedcvars = true;
		}
	}
	// Only load mod cvars from the config if we defined some, so we don't
	// clutter up the cvar space when not playing mods with custom cvars.
	if (addedcvars)
	{
		GameConfig->DoModSetup (gameinfo.ConfigName);
	}
}